

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O2

Vec_Int_t * Ssw_MatchingMiter(Aig_Man_t *pMiter,Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairsAll)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  ulong uVar6;
  int i;
  
  p = Vec_IntAlloc((p0->vObjs->nSize - p0->nDeleted) * 2);
  i = 0;
  do {
    if (vPairsAll->nSize <= i) {
      return p;
    }
    iVar1 = Vec_IntEntry(vPairsAll,i);
    pAVar3 = Aig_ManObj(p0,iVar1);
    iVar1 = Vec_IntEntry(vPairsAll,i + 1);
    pAVar4 = Aig_ManObj(p1,iVar1);
    pAVar3 = (Aig_Obj_t *)(pAVar3->field_5).pData;
    if (pAVar3 == (Aig_Obj_t *)0x0) {
      __assert_fail("pObj0->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                    ,0x17d,
                    "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                   );
    }
    pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      __assert_fail("pObj1->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                    ,0x17e,
                    "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                   );
    }
    if (pAVar3 != pAVar4) {
      uVar6 = *(ulong *)&pAVar3->field_0x18 & 7;
      if ((uVar6 != 0) && ((*(ulong *)&pAVar4->field_0x18 & 7) != 0)) {
        if (((ulong)pAVar3 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                        ,0x186,
                        "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                       );
        }
        if (((ulong)pAVar4 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                        ,0x187,
                        "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                       );
        }
        uVar5 = (uint)*(ulong *)&pAVar3->field_0x18 & 7;
        uVar2 = (uint)*(ulong *)&pAVar4->field_0x18 & 7;
        if (uVar5 != uVar2) {
          __assert_fail("Aig_ObjType(pObj0) == Aig_ObjType(pObj1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                        ,0x188,
                        "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                       );
        }
        if ((int)uVar6 != 3) {
          if (uVar5 - 7 < 0xfffffffe) {
            iVar1 = Saig_ObjIsLo(pMiter,pAVar3);
            if (iVar1 == 0) {
              __assert_fail("Aig_ObjIsNode(pObj0) || Saig_ObjIsLo(pMiter, pObj0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                            ,0x18b,
                            "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                           );
            }
            uVar2 = *(uint *)&pAVar4->field_0x18 & 7;
          }
          if (uVar2 - 7 < 0xfffffffe) {
            iVar1 = Saig_ObjIsLo(pMiter,pAVar4);
            if (iVar1 == 0) {
              __assert_fail("Aig_ObjIsNode(pObj1) || Saig_ObjIsLo(pMiter, pObj1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                            ,0x18c,
                            "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                           );
            }
          }
          if (pAVar4->Id <= pAVar3->Id) {
            __assert_fail("pObj0->Id < pObj1->Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                          ,0x18d,
                          "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                         );
          }
          Vec_IntPush(p,pAVar3->Id);
          Vec_IntPush(p,pAVar4->Id);
        }
      }
    }
    i = i + 2;
  } while( true );
}

Assistant:

Vec_Int_t * Ssw_MatchingMiter( Aig_Man_t * pMiter, Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairsAll )
{
    Vec_Int_t * vPairsMiter;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // create matching of nodes in the miter
    vPairsMiter = Vec_IntAlloc( 2*Aig_ManObjNum(p0) );
    for ( i = 0; i < Vec_IntSize(vPairsAll); i += 2 )
    {
        pObj0 = Aig_ManObj( p0, Vec_IntEntry(vPairsAll, i) );
        pObj1 = Aig_ManObj( p1, Vec_IntEntry(vPairsAll, i+1) );
        assert( pObj0->pData != NULL );
        assert( pObj1->pData != NULL );
        if ( pObj0->pData == pObj1->pData )
            continue;
        if ( Aig_ObjIsNone((Aig_Obj_t *)pObj0->pData) || Aig_ObjIsNone((Aig_Obj_t *)pObj1->pData) )
            continue;
        // get the miter nodes
        pObj0 = (Aig_Obj_t *)pObj0->pData;
        pObj1 = (Aig_Obj_t *)pObj1->pData;
        assert( !Aig_IsComplement(pObj0) );
        assert( !Aig_IsComplement(pObj1) );
        assert( Aig_ObjType(pObj0) == Aig_ObjType(pObj1) );
        if ( Aig_ObjIsCo(pObj0) )
            continue;
        assert( Aig_ObjIsNode(pObj0) || Saig_ObjIsLo(pMiter, pObj0) );
        assert( Aig_ObjIsNode(pObj1) || Saig_ObjIsLo(pMiter, pObj1) );
        assert( pObj0->Id < pObj1->Id );
        Vec_IntPush( vPairsMiter, pObj0->Id );
        Vec_IntPush( vPairsMiter, pObj1->Id );
    }
    return vPairsMiter;
}